

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::CapturePageHeapAllocStack(LargeHeapBlock *this)

{
  PageHeapData *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackBackTrace *pSVar5;
  
  pPVar1 = this->pageHeapData;
  if ((pPVar1 != (PageHeapData *)0x0) && (pPVar1->pageHeapMode != PageHeapModeOff)) {
    if (pPVar1->pageHeapFreeStack != (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x974,"(this->pageHeapData->pageHeapFreeStack == nullptr)",
                         "this->pageHeapData->pageHeapFreeStack == nullptr");
      if (!bVar3) goto LAB_006f483a;
      *puVar4 = 0;
    }
    if (this->pageHeapData->pageHeapAllocStack != (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x975,"(this->pageHeapData->pageHeapAllocStack == nullptr)",
                         "this->pageHeapData->pageHeapAllocStack == nullptr");
      if (!bVar3) {
LAB_006f483a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    pSVar5 = this->pageHeapData->pageHeapAllocStack;
    if ((pSVar5 == (StackBackTrace *)0x0) || (pSVar5 == PageHeapData::s_StackTraceAllocFailed)) {
      pSVar5 = StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
                         ((NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,10,0x20);
      this->pageHeapData->pageHeapAllocStack = pSVar5;
    }
    else {
      StackBackTrace::Capture(pSVar5,10);
    }
    if (this->pageHeapData->pageHeapAllocStack == (StackBackTrace *)0x0) {
      this->pageHeapData->pageHeapAllocStack = PageHeapData::s_StackTraceAllocFailed;
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::CapturePageHeapAllocStack()
{
#ifdef STACK_BACK_TRACE
    if (this->InPageHeapMode()) // pageheap can be enabled only for some of the buckets
    {
        // These asserts are true because explicit free is disallowed in
        // page heap mode. If they weren't, we'd have to modify the asserts
        Assert(this->pageHeapData->pageHeapFreeStack == nullptr);
        Assert(this->pageHeapData->pageHeapAllocStack == nullptr);

        // Note: NoCheckHeapAllocator will fail fast if we can't allocate the stack to capture
        // REVIEW: Should we have a flag to configure the number of frames captured?
        if (pageHeapData->pageHeapAllocStack != nullptr && this->pageHeapData->pageHeapAllocStack != PageHeapData::s_StackTraceAllocFailed)
        {
            this->pageHeapData->pageHeapAllocStack->Capture(Recycler::s_numFramesToSkipForPageHeapAlloc);
        }
        else
        {
            this->pageHeapData->pageHeapAllocStack = StackBackTrace::Capture(&NoThrowHeapAllocator::Instance,
                Recycler::s_numFramesToSkipForPageHeapAlloc, Recycler::s_numFramesToCaptureForPageHeap);
        }

        if (this->pageHeapData->pageHeapAllocStack == nullptr)
        {
            this->pageHeapData->pageHeapAllocStack = const_cast<StackBackTrace*>(PageHeapData::s_StackTraceAllocFailed); // allocate failed, mark it we have tried
        }
    }
#endif
}